

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWCommon.cxx
# Opt level: O0

void __thiscall cmCPackIFWCommon::WriteGeneratedByToStrim(cmCPackIFWCommon *this,cmXMLWriter *xout)

{
  bool bVar1;
  ostream *poVar2;
  char *comment_00;
  string local_210 [39];
  allocator<char> local_1e9;
  string local_1e8;
  cmTimestamp local_1c1;
  string local_1c0;
  undefined1 local_190 [8];
  ostringstream comment;
  cmXMLWriter *xout_local;
  cmCPackIFWCommon *this_local;
  
  if (this->Generator != (cmCPackIFWGenerator *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    poVar2 = std::operator<<((ostream *)local_190,"Generated by CPack ");
    poVar2 = std::operator<<(poVar2,"3.14.20190320-g51f3a");
    poVar2 = std::operator<<(poVar2," IFW generator ");
    std::operator<<(poVar2,"for QtIFW ");
    bVar1 = IsVersionEqual(this,"1.9.9");
    if (bVar1) {
      std::operator<<((ostream *)local_190,"less 2.0");
    }
    else {
      std::operator<<((ostream *)local_190,(string *)&this->Generator->FrameworkVersion);
    }
    poVar2 = std::operator<<((ostream *)local_190," tools at ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"",&local_1e9);
    cmTimestamp::CurrentTime(&local_1c0,&local_1c1,&local_1e8,true);
    std::operator<<(poVar2,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    std::__cxx11::ostringstream::str();
    comment_00 = (char *)std::__cxx11::string::c_str();
    cmXMLWriter::Comment(xout,comment_00);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  }
  return;
}

Assistant:

void cmCPackIFWCommon::WriteGeneratedByToStrim(cmXMLWriter& xout)
{
  if (!this->Generator) {
    return;
  }

  std::ostringstream comment;
  comment << "Generated by CPack " << CMake_VERSION << " IFW generator "
          << "for QtIFW ";
  if (this->IsVersionEqual("1.9.9")) {
    comment << "less 2.0";
  } else {
    comment << this->Generator->FrameworkVersion;
  }
  comment << " tools at " << cmTimestamp().CurrentTime("", true);
  xout.Comment(comment.str().c_str());
}